

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::ResolveNodeInstances
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,
          vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
          *resolved)

{
  const_iterator cVar1;
  Logger *this_00;
  key_type *__k;
  key_type *pkVar2;
  Node *nd;
  value_type local_1e0;
  key_type *local_1d8;
  _Base_ptr local_1d0;
  char *local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::
  reserve(resolved,(long)(pNode->mNodeInstances).
                         super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pNode->mNodeInstances).
                         super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
  __k = &((pNode->mNodeInstances).
          super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
          ._M_impl.super__Vector_impl_data._M_start)->mNode;
  pkVar2 = &((pNode->mNodeInstances).
             super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
             ._M_impl.super__Vector_impl_data._M_finish)->mNode;
  local_1d0 = &(pParser->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d8 = pkVar2;
  do {
    if (__k == pkVar2) {
      return;
    }
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
            ::find(&(pParser->mNodeLibrary)._M_t,__k);
    if ((cVar1._M_node == local_1d0) ||
       (local_1e0 = *(value_type *)(cVar1._M_node + 2), local_1e0 == (Node *)0x0)) {
      local_1e0 = (value_type)0x0;
      local_1e0 = FindNode(this,pParser->mRootNode,__k);
      if (local_1e0 != (Node *)0x0) goto LAB_003e7670;
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[56]>
                (&local_1a8,(char (*) [56])"Collada: Unable to resolve reference to instanced node "
                );
      std::operator<<((ostream *)&local_1a8,(string *)__k);
      std::__cxx11::stringbuf::str();
      Logger::error(this_00,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      pkVar2 = local_1d8;
    }
    else {
LAB_003e7670:
      std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::
      push_back(resolved,&local_1e0);
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

void ColladaLoader::ResolveNodeInstances(const ColladaParser& pParser, const Collada::Node* pNode,
    std::vector<const Collada::Node*>& resolved) {
    // reserve enough storage
    resolved.reserve(pNode->mNodeInstances.size());

    // ... and iterate through all nodes to be instanced as children of pNode
    for (const auto &nodeInst : pNode->mNodeInstances) {
        // find the corresponding node in the library
        const ColladaParser::NodeLibrary::const_iterator itt = pParser.mNodeLibrary.find(nodeInst.mNode);
        const Collada::Node* nd = itt == pParser.mNodeLibrary.end() ? NULL : (*itt).second;

        // FIX for http://sourceforge.net/tracker/?func=detail&aid=3054873&group_id=226462&atid=1067632
        // need to check for both name and ID to catch all. To avoid breaking valid files,
        // the workaround is only enabled when the first attempt to resolve the node has failed.
        if (nullptr == nd) {
            nd = FindNode(pParser.mRootNode, nodeInst.mNode);
        }
        if (nullptr == nd) {
            ASSIMP_LOG_ERROR_F("Collada: Unable to resolve reference to instanced node ", nodeInst.mNode);
        } else {
            //  attach this node to the list of children
            resolved.push_back(nd);
        }
    }
}